

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Table *pTab;
  Vdbe *pVVar6;
  Schema *pSVar7;
  i16 *piVar8;
  undefined1 auVar9 [16];
  u8 uVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int addr;
  Select *pSVar16;
  KeyInfo *zP4;
  CollSeq *pCVar17;
  Expr *pEVar18;
  undefined1 *puVar19;
  Expr *pEVar20;
  Expr *pLeft;
  int iVar21;
  char *pcVar22;
  Op *pOVar23;
  long lVar24;
  Schema **ppSVar25;
  Index *pIdx;
  uint uVar26;
  ulong uVar27;
  SrcList **ppSVar28;
  ExprList_item *pEVar29;
  int iVar30;
  u32 uVar31;
  Op *pOVar32;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  SelectDest dest;
  char local_b1;
  Expr *local_b0;
  ulong local_a8;
  ulong local_a0;
  Vdbe *local_98;
  ulong local_90;
  ExprList_item *local_88;
  Expr *local_80;
  int local_74;
  int *local_70;
  int *local_68;
  undefined1 local_60 [16];
  _func_int_Walker_ptr_Select_ptr *p_Stack_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  local_a0 = (ulong)(uint)pParse->nTab;
  pParse->nTab = pParse->nTab + 1;
  local_70 = aiMap;
  local_68 = piTab;
  local_98 = sqlite3GetVdbe(pParse);
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar4 = ((pX->x).pSelect)->pEList;
    uVar26 = pEVar4->nExpr;
    if ((int)uVar26 < 1) {
      uVar33 = 0;
    }
    else {
      pEVar29 = pEVar4->a;
      uVar33 = 0;
      do {
        iVar13 = sqlite3ExprCanBeNull(pEVar29->pExpr);
        if (iVar13 != 0) goto LAB_0016f385;
        uVar33 = uVar33 + 1;
        pEVar29 = pEVar29 + 1;
      } while (uVar26 != uVar33);
      uVar33 = (ulong)uVar26;
    }
LAB_0016f385:
    if ((uint)uVar33 == uVar26) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar16 = (pX->x).pSelect, pSVar16->pPrior == (Select *)0x0)) &&
       (((pSVar16->selFlags & 9) == 0 && (pSVar16->pLimit == (Expr *)0x0)))) &&
      ((pSVar16->pWhere == (Expr *)0x0 &&
       ((pSVar5 = pSVar16->pSrc, pSVar5->nSrc == 1 && (pSVar5->a[0].pSelect == (Select *)0x0))))))
     && (pTab = pSVar5->a[0].pTab, pTab->nModuleArg == 0)) {
    uVar26 = pSVar16->pEList->nExpr;
    puVar19 = (undefined1 *)(ulong)uVar26;
    pEVar29 = pSVar16->pEList->a;
    if (0 < (int)uVar26) {
      lVar24 = 0;
      do {
        if (**(char **)((long)&pEVar29->pExpr + lVar24) != -0x5e) goto LAB_0016f3f1;
        lVar24 = lVar24 + 0x20;
      } while ((long)puVar19 << 5 != lVar24);
    }
    if (pTab->pSchema == (Schema *)0x0) {
      iVar13 = -0x4240;
    }
    else {
      iVar13 = -0x10000;
      ppSVar25 = &pParse->db->aDb->pSchema;
      do {
        iVar13 = iVar13 + 0x10000;
        pSVar7 = *ppSVar25;
        ppSVar25 = ppSVar25 + 4;
      } while (pSVar7 != pTab->pSchema);
      iVar13 = iVar13 >> 0x10;
    }
    sqlite3CodeVerifySchema(pParse,iVar13);
    local_74 = iVar13;
    sqlite3TableLock(pParse,iVar13,pTab->tnum,'\0',pTab->zName);
    pVVar6 = local_98;
    local_88 = pEVar29;
    if (uVar26 != 1) {
      if (0 < (int)uVar26) goto LAB_0016fca7;
LAB_0016fd23:
      pIdx = pTab->pIndex;
      if (pIdx != (Index *)0x0) {
        local_90 = -1L << ((byte)uVar26 & 0x3f);
        pEVar29 = local_88;
        local_b0 = pX;
        do {
          uVar2 = pIdx->nColumn;
          if (((((int)uVar26 <= (int)(uint)uVar2) && (uVar2 < 0x3f)) &&
              (pIdx->pPartIdxWhere == (Expr *)0x0)) &&
             (((inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar26 &&
               ((uVar2 <= uVar26 || (pIdx->onError != '\0')))))))) {
            if ((int)uVar26 < 1) {
              uVar33 = 0;
            }
            else {
              pEVar20 = (Expr *)0x0;
              uVar33 = 0;
              do {
                local_a8 = uVar33;
                pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)pEVar20);
                pEVar18 = pEVar29[(long)pEVar20].pExpr;
                local_80 = pEVar20;
                pCVar17 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar18);
                piVar8 = pIdx->aiColumn;
                sVar3 = pEVar18->iColumn;
                uVar27 = 0;
                while ((piVar8[uVar27] != sVar3 ||
                       ((pCVar17 != (CollSeq *)0x0 &&
                        (iVar13 = sqlite3StrICmp(pCVar17->zName,pIdx->azColl[uVar27]), iVar13 != 0))
                       ))) {
                  uVar27 = uVar27 + 1;
                  uVar33 = local_a8;
                  pX = local_b0;
                  pEVar29 = local_88;
                  if (puVar19 == (undefined1 *)uVar27) goto LAB_0016fe93;
                }
                uVar33 = local_a8;
                pX = local_b0;
                pEVar29 = local_88;
                if ((uVar26 == (uint)uVar27) || ((local_a8 >> (uVar27 & 0x3f) & 1) != 0)) break;
                if (local_70 != (int *)0x0) {
                  local_70[(long)local_80] = (uint)uVar27;
                }
                uVar33 = local_a8 | 1L << ((byte)uVar27 & 0x3f);
                pEVar20 = (Expr *)&local_80->affinity;
              } while (pEVar20 != (Expr *)puVar19);
            }
LAB_0016fe93:
            pVVar6 = local_98;
            if ((uVar33 ^ local_90) == 0xffffffffffffffff) {
              iVar13 = sqlite3VdbeAddOp3(local_98,0x11,0,0,0);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(pVVar6,0x6c,(int)local_a0,pIdx->tnum,local_74);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar1 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar21 = pParse->nMem + 1;
                pParse->nMem = iVar21;
                *prRhsHasNull = iVar21;
                if (uVar26 == 1) {
                  sqlite3SetHasNullFlag(local_98,(int)local_a0,iVar21);
                }
              }
              if (local_98->db->mallocFailed == '\0') {
                iVar21 = local_98->nOp + -1;
                if (-1 < iVar13) {
                  iVar21 = iVar13;
                }
                pOVar23 = local_98->aOp + iVar21;
              }
              else {
                pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              iVar13 = bVar1 + 3;
              pOVar23->p2 = local_98->nOp;
              goto LAB_0016fa63;
            }
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_0016f3f1;
    }
    if (-1 < pEVar29->pExpr->iColumn) {
LAB_0016fca7:
      uVar33 = 0;
      do {
        pEVar20 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar33);
        lVar24 = (long)pEVar29->pExpr->iColumn;
        if (lVar24 < 0) {
          cVar11 = 'D';
        }
        else {
          cVar11 = pTab->aCol[lVar24].affinity;
        }
        cVar12 = sqlite3CompareAffinity(pEVar20,cVar11);
        bVar34 = (byte)(cVar12 + 0xbfU) < 2;
        uVar33 = uVar33 + 1;
      } while ((uVar33 < puVar19) && (pEVar29 = pEVar29 + 1, 'B' < cVar11 || bVar34));
      if ('B' >= cVar11 && !bVar34) goto LAB_0016f3f1;
      goto LAB_0016fd23;
    }
    iVar21 = sqlite3VdbeAddOp3(local_98,0x11,0,0,0);
    sqlite3OpenTable(pParse,(int)local_a0,local_74,pTab,0x6c);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName);
    iVar13 = pVVar6->nOp;
    if (pVVar6->db->mallocFailed == '\0') {
      iVar14 = iVar13 + -1;
      if (-1 < iVar21) {
        iVar14 = iVar21;
      }
      pOVar23 = local_98->aOp + iVar14;
    }
    else {
      pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar23->p2 = iVar13;
    iVar13 = 1;
  }
  else {
LAB_0016f3f1:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar20 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_3c = '\x01';
      p_Stack_50 = sqlite3SelectWalkFail;
      local_60._8_8_ = exprNodeIsConstant;
      local_38.n = 0;
      walkExpr((Walker *)local_60,pX);
      pX->pLeft = pEVar20;
      iVar13 = 5;
      if ((local_3c == '\0') || (((pX->x).pList)->nExpr < 3)) goto LAB_0016fa63;
    }
    uVar31 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      if (prRhsHasNull == (int *)0x0) goto LAB_0016f496;
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
      *prRhsHasNull = iVar13;
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0016f496:
      iVar13 = 0;
    }
    pVVar6 = pParse->pVdbe;
    uVar26 = pX->flags;
    iVar21 = 0;
    if (((uVar26 & 0x20) == 0) && (pParse->iSelfTab == 0)) {
      if ((uVar26 >> 0x19 & 1) == 0) {
        pX->flags = uVar26 | 0x2000000;
        iVar21 = pParse->nMem + 1;
        pParse->nMem = iVar21;
        (pX->y).sub.regReturn = iVar21;
        iVar21 = sqlite3VdbeAddOp3(pVVar6,0x46,0,iVar21,0);
        (pX->y).sub.iAddr = iVar21 + 1;
        iVar21 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
        goto LAB_0016f509;
      }
      iVar21 = sqlite3VdbeAddOp3(pVVar6,0x11,0,0,0);
      if ((pX->flags & 0x800) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pX->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp3(pVVar6,0xc,(pX->y).sub.regReturn,(pX->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(pVVar6,0x6f,(int)local_a0,pX->iTable,0);
      if (pVVar6->db->mallocFailed == '\0') {
        iVar14 = pVVar6->nOp + -1;
        if (-1 < iVar21) {
          iVar14 = iVar21;
        }
        pOVar23 = pVVar6->aOp + iVar14;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = pVVar6->nOp;
    }
    else {
LAB_0016f509:
      local_80 = pX->pLeft;
      uVar10 = local_80->op;
      if (uVar10 == 0xa8) {
        uVar10 = local_80->op2;
      }
      if (uVar10 == 0x83) {
        pSVar16 = (local_80->x).pSelect;
LAB_0016f534:
        uVar26 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar16->pEList)->pList->nExpr;
      }
      else {
        uVar26 = 1;
        if (uVar10 == 0xa9) {
          pSVar16 = (Select *)&local_80->x;
          goto LAB_0016f534;
        }
      }
      pX->iTable = (int)local_a0;
      iVar14 = sqlite3VdbeAddOp3(pVVar6,0x71,(int)local_a0,uVar26,0);
      local_88 = (ExprList_item *)CONCAT44(local_88._4_4_,iVar14);
      zP4 = sqlite3KeyInfoAlloc(pParse->db,uVar26,1);
      pSVar16 = (pX->x).pSelect;
      local_b0 = pX;
      if ((pX->flags & 0x800) == 0) {
        if (pSVar16 != (Select *)0x0) {
          cVar11 = sqlite3ExprAffinity(local_80);
          local_b1 = 'A';
          if (cVar11 != '\0') {
            local_b1 = cVar11;
          }
          if (zP4 != (KeyInfo *)0x0) {
            pCVar17 = sqlite3ExprCollSeq(pParse,local_b0->pLeft);
            zP4->aColl[0] = pCVar17;
          }
          uVar10 = pParse->nTempReg;
          local_90 = CONCAT44(local_90._4_4_,uVar31);
          local_a8 = CONCAT44(local_a8._4_4_,iVar13);
          if (uVar10 == '\0') {
            iVar13 = pParse->nMem + 1;
            pParse->nMem = iVar13;
LAB_0016f71e:
            iVar14 = pParse->nMem + 1;
            pParse->nMem = iVar14;
          }
          else {
            bVar1 = uVar10 - 1;
            pParse->nTempReg = bVar1;
            iVar13 = pParse->aTempReg[bVar1];
            if (bVar1 == 0) goto LAB_0016f71e;
            pParse->nTempReg = uVar10 - 2;
            iVar14 = pParse->aTempReg[(byte)(uVar10 - 2)];
          }
          if (0 < *(int *)&pSVar16->pEList) {
            ppSVar28 = (SrcList **)&pSVar16->op;
            iVar30 = *(int *)&pSVar16->pEList + 1;
            do {
              pSVar5 = *ppSVar28;
              if (iVar21 == 0) {
LAB_0016f7a1:
                iVar21 = 0;
              }
              else {
                local_3c = '\x01';
                p_Stack_50 = sqlite3SelectWalkFail;
                local_60._8_8_ = exprNodeIsConstant;
                local_38.n = 0;
                if ((pSVar5 != (SrcList *)0x0) &&
                   (walkExpr((Walker *)local_60,(Expr *)pSVar5), local_3c == '\0')) {
                  sqlite3VdbeChangeToNoop(pVVar6,iVar21);
                  goto LAB_0016f7a1;
                }
              }
              iVar15 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar5,iVar13);
              addr = sqlite3VdbeAddOp3(pVVar6,0x5c,iVar15,1,iVar14);
              sqlite3VdbeChangeP4(pVVar6,addr,&local_b1,1);
              iVar15 = sqlite3VdbeAddOp3(pVVar6,0x84,(int)local_a0,iVar14,iVar15);
              if (pVVar6->db->mallocFailed == '\0') {
                pOVar23 = pVVar6->aOp;
                pOVar23[iVar15].p4type = -3;
                pOVar23[iVar15].p4.i = 1;
              }
              ppSVar28 = ppSVar28 + 4;
              iVar30 = iVar30 + -1;
            } while (1 < iVar30);
          }
          if (iVar13 != 0) {
            bVar1 = pParse->nTempReg;
            if ((ulong)bVar1 < 8) {
              pParse->nTempReg = bVar1 + 1;
              pParse->aTempReg[bVar1] = iVar13;
            }
          }
          if (iVar14 != 0) {
            bVar1 = pParse->nTempReg;
            if ((ulong)bVar1 < 8) {
              pParse->nTempReg = bVar1 + 1;
              pParse->aTempReg[bVar1] = iVar14;
            }
          }
          uVar31 = (u32)local_90;
          iVar13 = (int)local_a8;
        }
      }
      else {
        local_a8 = CONCAT44(local_a8._4_4_,iVar13);
        pEVar4 = pSVar16->pEList;
        pcVar22 = "";
        if (iVar21 == 0) {
          pcVar22 = "CORRELATED ";
        }
        sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar22);
        if (pEVar4->nExpr == uVar26) {
          local_90 = CONCAT44(local_90._4_4_,uVar31);
          local_60[0] = '\v';
          local_60._4_4_ = (undefined4)local_a0;
          stack0xffffffffffffffa8 = (undefined1  [16])0x0;
          pcVar22 = exprINAffinity(pParse,local_b0);
          p_Stack_50 = (_func_int_Walker_ptr_Select_ptr *)pcVar22;
          pSVar16->iLimit = 0;
          iVar13 = sqlite3Select(pParse,pSVar16,(SelectDest *)local_60);
          if (iVar13 != 0) {
            uVar31 = (u32)local_90;
            if (p_Stack_50 != (_func_int_Walker_ptr_Select_ptr *)0x0) {
              sqlite3DbFreeNN(pParse->db,p_Stack_50);
            }
            pX = local_b0;
            iVar13 = (int)local_a8;
            if ((zP4 != (KeyInfo *)0x0) && (zP4->nRef = zP4->nRef - 1, zP4->nRef == 0)) {
              sqlite3DbFreeNN(zP4->db,zP4);
            }
            goto LAB_0016fa3f;
          }
          if (p_Stack_50 != (_func_int_Walker_ptr_Select_ptr *)0x0) {
            sqlite3DbFreeNN(pParse->db,p_Stack_50);
          }
          pEVar20 = local_80;
          if (0 < (int)uVar26) {
            pEVar29 = pEVar4->a;
            uVar33 = 0;
            do {
              pEVar18 = sqlite3VectorFieldSubexpr(pEVar20,(int)uVar33);
              pCVar17 = sqlite3BinaryCompareCollSeq(pParse,pEVar18,pEVar29->pExpr);
              zP4->aColl[uVar33] = pCVar17;
              uVar33 = uVar33 + 1;
              pEVar29 = pEVar29 + 1;
            } while (uVar26 != uVar33);
          }
          uVar31 = (u32)local_90;
          iVar13 = (int)local_a8;
        }
        else {
          iVar13 = (int)local_a8;
        }
      }
      pX = local_b0;
      if (zP4 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(pVVar6,(int)local_88,(char *)zP4,-9);
      }
      if (iVar21 != 0) {
        pOVar32 = (Op *)&sqlite3VdbeGetOp_dummy;
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar14 = pVVar6->nOp + -1;
          if (-1 < iVar21) {
            iVar14 = iVar21;
          }
          pOVar23 = pVVar6->aOp + iVar14;
        }
        pOVar23->p2 = pVVar6->nOp;
        sqlite3VdbeAddOp3(pVVar6,0x42,(pX->y).sub.regReturn,0,0);
        iVar21 = pVVar6->nOp + -1;
        if (pVVar6->db->mallocFailed == '\0') {
          iVar14 = (pX->y).sub.iAddr;
          iVar30 = iVar14 + -1;
          if (iVar14 < 1) {
            iVar30 = iVar21;
          }
          pOVar32 = pVVar6->aOp + iVar30;
        }
        pOVar32->p1 = iVar21;
      }
    }
LAB_0016fa3f:
    if (iVar13 != 0) {
      sqlite3SetHasNullFlag(local_98,(int)local_a0,iVar13);
    }
    pParse->nQueryLoop = uVar31;
    iVar13 = 2;
  }
LAB_0016fa63:
  auVar9 = _DAT_001d4f80;
  if ((local_70 == (int *)0x0) || (0xfffffffd < iVar13 - 5U)) goto LAB_0016fb43;
  pEVar20 = pX->pLeft;
  uVar10 = pEVar20->op;
  if (uVar10 == 0xa8) {
    uVar10 = pEVar20->op2;
  }
  if (uVar10 == 0x83) {
    pSVar16 = (pEVar20->x).pSelect;
LAB_0016faaa:
    uVar26 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar16->pEList)->pList->nExpr;
    if ((int)uVar26 < 1) goto LAB_0016fb43;
  }
  else {
    uVar26 = 1;
    if (uVar10 == 0xa9) {
      pSVar16 = (Select *)&pEVar20->x;
      goto LAB_0016faaa;
    }
  }
  lVar24 = (ulong)uVar26 - 1;
  auVar35._8_4_ = (int)lVar24;
  auVar35._0_8_ = lVar24;
  auVar35._12_4_ = (int)((ulong)lVar24 >> 0x20);
  uVar33 = 0;
  auVar35 = auVar35 ^ _DAT_001d4f80;
  auVar36 = _DAT_001df110;
  do {
    auVar37 = auVar36 ^ auVar9;
    if ((bool)(~(auVar37._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar37._0_4_ ||
                auVar35._4_4_ < auVar37._4_4_) & 1)) {
      local_70[uVar33] = (int)uVar33;
    }
    if ((auVar37._12_4_ != auVar35._12_4_ || auVar37._8_4_ <= auVar35._8_4_) &&
        auVar37._12_4_ <= auVar35._12_4_) {
      local_70[uVar33 + 1] = (int)uVar33 + 1;
    }
    uVar33 = uVar33 + 2;
    lVar24 = auVar36._8_8_;
    auVar36._0_8_ = auVar36._0_8_ + 2;
    auVar36._8_8_ = lVar24 + 2;
  } while ((uVar26 + 1 & 0xfffffffe) != uVar33);
LAB_0016fb43:
  *local_68 = (int)local_a0;
  return iVar13;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}